

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O3

void ncnn::lstm_dynamic_quantize
               (Mat *bottom_blob,Mat *bottom_blob_int8,Mat *bottom_blob_int8_descales,Option *opt)

{
  int _w;
  int _w_00;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  float *ptr;
  float fVar5;
  
  _w = bottom_blob->w;
  _w_00 = bottom_blob->h;
  Mat::create(bottom_blob_int8_descales,_w_00,4,1,opt->blob_allocator);
  Mat::create(bottom_blob_int8,_w,_w_00,1,opt->blob_allocator);
  if (0 < (long)_w_00) {
    lVar4 = 0;
    do {
      ptr = (float *)(bottom_blob->w * lVar4 * bottom_blob->elemsize + (long)bottom_blob->data);
      iVar1 = bottom_blob_int8->w;
      sVar2 = bottom_blob_int8->elemsize;
      pvVar3 = bottom_blob_int8->data;
      fVar5 = lstm_dynamic_quantize_get_absmax(ptr,_w);
      *(float *)((long)bottom_blob_int8_descales->data + lVar4 * 4) = fVar5 * 0.007874016;
      lstm_dynamic_quantize_scale2int8
                (ptr,_w,127.0 / fVar5,(char *)(iVar1 * lVar4 * sVar2 + (long)pvVar3));
      lVar4 = lVar4 + 1;
    } while (_w_00 != lVar4);
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize(const Mat& bottom_blob, Mat& bottom_blob_int8, Mat& bottom_blob_int8_descales, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    // dynamic quantize bottom_blob
    bottom_blob_int8_descales.create(T, (size_t)4u, 1, opt.blob_allocator);

    bottom_blob_int8.create(size, T, (size_t)1u, opt.blob_allocator);

    // fp32
    for (int t = 0; t < T; t++)
    {
        const float* ptr = bottom_blob.row(t);
        signed char* outptr = bottom_blob_int8.row<signed char>(t);

        const float absmax = lstm_dynamic_quantize_get_absmax(ptr, size);

        bottom_blob_int8_descales[t] = absmax / 127.f;

        const float scale = 127.f / absmax;
        lstm_dynamic_quantize_scale2int8(ptr, size, scale, outptr);
    }
}